

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_name.h
# Opt level: O1

string * beast::type_name<std::invalid_argument>(void)

{
  char *pcVar1;
  char *__ptr;
  char *pcVar2;
  string *in_RDI;
  allocator local_19;
  
  pcVar1 = __invalid_argument;
  __ptr = (char *)__cxa_demangle(__invalid_argument + (*__invalid_argument == '*'),0,0,0);
  pcVar2 = __ptr;
  if (__ptr == (char *)0x0) {
    pcVar2 = pcVar1 + (*pcVar1 == '*');
  }
  std::__cxx11::string::string((string *)in_RDI,pcVar2,&local_19);
  if (__ptr != (char *)0x0) {
    free(__ptr);
  }
  return in_RDI;
}

Assistant:

std::string
type_name()
{
    using TR = typename std::remove_reference<T>::type;
    std::unique_ptr<char, void(*)(void*)> own (
    #ifndef _MSC_VER
        abi::__cxa_demangle (typeid(TR).name(), nullptr,
            nullptr, nullptr),
    #else
            nullptr,
    #endif
            std::free
    );
    std::string r = own != nullptr ? own.get() : typeid(TR).name();
    if (std::is_const<TR>::value)
        r += " const";
    if (std::is_volatile<TR>::value)
        r += " volatile";
    if (std::is_lvalue_reference<T>::value)
        r += "&";
    else if (std::is_rvalue_reference<T>::value)
        r += "&&";
    return r;
}